

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFPB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double dVar2;
  double dVar3;
  undefined1 *puVar4;
  Vector *pVVar5;
  WorldCoordinates *pWVar6;
  KUINT16 i;
  long lVar7;
  KUINT16 j;
  long lVar8;
  undefined4 uVar9;
  double dVar10;
  TMATRIX R1;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> m;
  TMATRIX IMatrix;
  undefined1 local_e8 [16];
  KFLOAT64 local_d8;
  KFLOAT64 KStack_d0;
  float local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  WorldCoordinates local_a8;
  float local_88;
  Vector local_78;
  Vector local_50;
  Vector local_38;
  
  fVar1 = (float)this->m_f64Magnitude;
  dVar10 = (double)(fVar1 * (float)totalTimeSinceReset);
  if (dVar10 <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              ((Vector *)&local_a8,&this->m_initOrientationMatrixTranspose,
               &this->m_initLinearVelocity);
    DATA_TYPE::Vector::operator*(&local_78,(Vector *)&local_a8,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+
              ((WorldCoordinates *)local_e8,&this->m_initPosition,&local_78);
    PositionOut->m_f64Z = KStack_d0;
    PositionOut->m_f64X = (KFLOAT64)local_e8._8_8_;
    PositionOut->m_f64Y = local_d8;
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)local_e8);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
    pWVar6 = &local_a8;
  }
  else {
    local_c0 = sin(dVar10);
    local_b8 = (double)(fVar1 * fVar1 * fVar1);
    dVar2 = sin(dVar10);
    local_b0 = (double)(float)this->m_f64Magnitude;
    dVar3 = cos(dVar10);
    local_c8 = (this->m_wwMatrix).Data[2][2];
    local_d8 = *(KFLOAT64 *)((this->m_wwMatrix).Data[1] + 1);
    KStack_d0 = *(KFLOAT64 *)(this->m_wwMatrix).Data[2];
    local_e8._0_8_ = *(_func_int ***)(this->m_wwMatrix).Data[0];
    local_e8._8_8_ = *(KFLOAT64 *)((this->m_wwMatrix).Data[0] + 2);
    pVVar5 = &local_78;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar7 != lVar8) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)&(pVVar5->super_DataTypeBase)._vptr_DataTypeBase + lVar8 * 4) = uVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      pVVar5 = (Vector *)&pVVar5->m_f32Y;
    } while (lVar7 != 3);
    dVar10 = (dVar10 - local_c0) / local_b8;
    puVar4 = local_e8;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)(puVar4 + lVar8 * 4) = (float)((double)*(float *)(puVar4 + lVar8 * 4) * dVar10);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 0xc;
    } while (lVar7 != 3);
    pVVar5 = &local_78;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)((long)&(pVVar5->super_DataTypeBase)._vptr_DataTypeBase + lVar8 * 4) =
             (float)((double)*(float *)((long)&(pVVar5->super_DataTypeBase)._vptr_DataTypeBase +
                                       lVar8 * 4) * (dVar2 / local_b0));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      pVVar5 = (Vector *)&pVVar5->m_f32Y;
    } while (lVar7 != 3);
    puVar4 = local_e8;
    pVVar5 = &local_78;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)(puVar4 + lVar8 * 4) =
             *(float *)((long)&(pVVar5->super_DataTypeBase)._vptr_DataTypeBase + lVar8 * 4) +
             *(float *)(puVar4 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 0xc;
      pVVar5 = (Vector *)&pVVar5->m_f32Y;
    } while (lVar7 != 3);
    pWVar6 = &local_a8;
    local_88 = (this->m_SkewOmegaMatrix).Data[2][2];
    local_a8.m_f64Y = *(KFLOAT64 *)((this->m_SkewOmegaMatrix).Data[1] + 1);
    local_a8.m_f64Z = *(KFLOAT64 *)(this->m_SkewOmegaMatrix).Data[2];
    local_a8.super_DataTypeBase._vptr_DataTypeBase =
         *(_func_int ***)(this->m_SkewOmegaMatrix).Data[0];
    local_a8.m_f64X = *(KFLOAT64 *)((this->m_SkewOmegaMatrix).Data[0] + 2);
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)((long)&(pWVar6->super_DataTypeBase)._vptr_DataTypeBase + lVar8 * 4) =
             (float)((double)*(float *)((long)&(pWVar6->super_DataTypeBase)._vptr_DataTypeBase +
                                       lVar8 * 4) * ((1.0 - dVar3) / (double)(fVar1 * fVar1)));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      pWVar6 = (WorldCoordinates *)((long)&pWVar6->m_f64X + 4);
    } while (lVar7 != 3);
    puVar4 = local_e8;
    pWVar6 = &local_a8;
    lVar7 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)(puVar4 + lVar8 * 4) =
             *(float *)((long)&(pWVar6->super_DataTypeBase)._vptr_DataTypeBase + lVar8 * 4) +
             *(float *)(puVar4 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 0xc;
      pWVar6 = (WorldCoordinates *)((long)&pWVar6->m_f64X + 4);
    } while (lVar7 != 3);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_38,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_e8,
               &this->m_initLinearVelocity);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_50,&this->m_initOrientationMatrixTranspose,&local_38);
    DATA_TYPE::WorldCoordinates::operator+(&local_a8,&this->m_initPosition,&local_50);
    PositionOut->m_f64Z = local_a8.m_f64Z;
    PositionOut->m_f64X = local_a8.m_f64X;
    PositionOut->m_f64Y = local_a8.m_f64Y;
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_a8.super_DataTypeBase);
    DATA_TYPE::DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
    pWVar6 = (WorldCoordinates *)&local_38;
  }
  DATA_TYPE::DataTypeBase::~DataTypeBase(&pWVar6->super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFPB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // See page 124 of IEEE 1278.1 - 1995 for more details on this and other dead reckoning equations.

    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;

        const KFLOAT64 f64Scalar = ( ( f64DeltaMag ) - sin( f64DeltaMag ) ) / m_f32MagPow3;
        const KFLOAT64 f64IScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        const KFLOAT64 f64SkewScale = ( 1 - cos( f64DeltaMag ) ) / m_f32MagPow2 ;
        TMATRIX R1( m_wwMatrix ), IMatrix;
        R1 *= f64Scalar;
        IMatrix *= f64IScalar;
        R1 += IMatrix;
        R1 += ( m_SkewOmegaMatrix * f64SkewScale ); // RI - should be + instead of - IEEE 1278.1-1995.pdf page 128

        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * ( R1 * m_initLinearVelocity ) ) );
    }
    else
    {
        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * m_initLinearVelocity * totalTimeSinceReset ) );
    }
}